

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

void __thiscall ALCcontext::setError(ALCcontext *this,ALenum errorCode,char *msg,...)

{
  uint uVar1;
  char in_AL;
  uint uVar2;
  char *pcVar3;
  size_type sVar4;
  ulong uVar5;
  undefined8 in_RCX;
  uint *puVar6;
  char *in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  ALenum curerr;
  int msglen;
  va_list args2;
  va_list args;
  vector<char> message;
  memory_order in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffdb0;
  uint in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  undefined1 local_198 [24];
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined4 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  uint local_dc;
  long local_d8;
  int local_bc;
  undefined8 local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined1 *puStack_90;
  undefined1 *local_88;
  vector<char,_al::allocator<char,_1UL>_> local_70;
  char *local_58;
  uint local_4c;
  long local_48;
  undefined4 local_40;
  uint local_3c;
  uint *local_38;
  uint *local_30;
  bool local_21;
  uint local_20;
  memory_order local_1c;
  undefined4 local_18;
  uint local_14;
  uint *local_10;
  uint *local_8;
  
  if (in_AL != '\0') {
    local_168 = in_XMM0_Da;
    local_158 = in_XMM1_Qa;
    local_148 = in_XMM2_Qa;
    local_138 = in_XMM3_Qa;
    local_128 = in_XMM4_Qa;
    local_118 = in_XMM5_Qa;
    local_108 = in_XMM6_Qa;
    local_f8 = in_XMM7_Qa;
  }
  local_180 = in_RCX;
  local_178 = in_R8;
  local_170 = in_R9;
  local_58 = in_RDX;
  local_4c = in_ESI;
  local_48 = in_RDI;
  std::vector<char,_al::allocator<char,_1UL>_>::vector
            ((vector<char,_al::allocator<char,_1UL>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  local_a8 = local_198;
  puStack_b0 = &stack0x00000008;
  uStack_94 = 0x30;
  local_98 = 0x18;
  local_b8 = 0x3000000018;
  puStack_90 = puStack_b0;
  local_88 = local_a8;
  pcVar3 = std::vector<char,_al::allocator<char,_1UL>_>::data
                     ((vector<char,_al::allocator<char,_1UL>_> *)0x1516dc);
  sVar4 = std::vector<char,_al::allocator<char,_1UL>_>::size(&local_70);
  local_bc = vsnprintf(pcVar3,sVar4,local_58,&local_98);
  if ((-1 < local_bc) &&
     (uVar5 = (ulong)local_bc, sVar4 = std::vector<char,_al::allocator<char,_1UL>_>::size(&local_70)
     , sVar4 <= uVar5)) {
    std::vector<char,_al::allocator<char,_1UL>_>::resize
              ((vector<char,_al::allocator<char,_1UL>_> *)
               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    pcVar3 = std::vector<char,_al::allocator<char,_1UL>_>::data
                       ((vector<char,_al::allocator<char,_1UL>_> *)0x15177e);
    sVar4 = std::vector<char,_al::allocator<char,_1UL>_>::size(&local_70);
    local_bc = vsnprintf(pcVar3,sVar4,local_58,&local_b8);
  }
  if (local_bc < 0) {
    local_58 = "<internal error constructing message>";
  }
  else {
    local_58 = std::vector<char,_al::allocator<char,_1UL>_>::data
                         ((vector<char,_al::allocator<char,_1UL>_> *)0x151809);
  }
  if (1 < (int)gLogLevel) {
    local_d8 = in_RDI;
    fprintf((FILE *)gLogFile,"[ALSOFT] (WW) Error generated on context %p, code 0x%04x, \"%s\"\n",
            in_RDI,(ulong)local_4c,local_58);
  }
  if ((TrapALError & 1U) != 0) {
    raise(5);
  }
  uVar1 = local_4c;
  local_dc = 0;
  puVar6 = (uint *)(in_RDI + 0x98);
  local_3c = local_4c;
  local_40 = 5;
  local_38 = &local_dc;
  local_30 = puVar6;
  local_1c = std::__cmpexch_failure_order(in_stack_fffffffffffffda4);
  local_14 = uVar1;
  local_18 = 5;
  local_20 = uVar1;
  switch(0x151a6a) {
  default:
    if (local_1c - memory_order_consume < 2) {
      LOCK();
      uVar2 = *puVar6;
      local_21 = local_dc == uVar2;
      if (local_21) {
        *puVar6 = uVar1;
        uVar2 = local_dc;
      }
      UNLOCK();
      if (!local_21) {
        local_dc = uVar2;
      }
    }
    else if (local_1c == memory_order_seq_cst) {
      LOCK();
      uVar2 = *puVar6;
      local_21 = local_dc == uVar2;
      if (local_21) {
        *puVar6 = uVar1;
        uVar2 = local_dc;
      }
      UNLOCK();
      if (!local_21) {
        local_dc = uVar2;
      }
    }
    else {
      LOCK();
      uVar2 = *puVar6;
      local_21 = local_dc == uVar2;
      if (local_21) {
        *puVar6 = uVar1;
        uVar2 = local_dc;
      }
      UNLOCK();
      if (!local_21) {
        local_dc = uVar2;
      }
    }
    break;
  case 2:
    if (local_1c - memory_order_consume < 2) {
      LOCK();
      uVar2 = *puVar6;
      local_21 = local_dc == uVar2;
      if (local_21) {
        *puVar6 = uVar1;
        uVar2 = local_dc;
      }
      UNLOCK();
      if (!local_21) {
        local_dc = uVar2;
      }
    }
    else if (local_1c == memory_order_seq_cst) {
      LOCK();
      uVar2 = *puVar6;
      local_21 = local_dc == uVar2;
      if (local_21) {
        *puVar6 = uVar1;
        uVar2 = local_dc;
      }
      UNLOCK();
      if (!local_21) {
        local_dc = uVar2;
      }
    }
    else {
      LOCK();
      uVar2 = *puVar6;
      local_21 = local_dc == uVar2;
      if (local_21) {
        *puVar6 = uVar1;
        uVar2 = local_dc;
      }
      UNLOCK();
      if (!local_21) {
        local_dc = uVar2;
      }
    }
    break;
  case 3:
    if (local_1c - memory_order_consume < 2) {
      LOCK();
      uVar2 = *puVar6;
      local_21 = local_dc == uVar2;
      if (local_21) {
        *puVar6 = uVar1;
        uVar2 = local_dc;
      }
      UNLOCK();
      if (!local_21) {
        local_dc = uVar2;
      }
    }
    else if (local_1c == memory_order_seq_cst) {
      LOCK();
      in_stack_fffffffffffffdb4 = *puVar6;
      local_21 = local_dc == in_stack_fffffffffffffdb4;
      if (local_21) {
        *puVar6 = uVar1;
        in_stack_fffffffffffffdb4 = local_dc;
      }
      UNLOCK();
      in_stack_fffffffffffffdb0 = CONCAT13(local_21,(int3)in_stack_fffffffffffffdb0);
      if (!local_21) {
        local_dc = in_stack_fffffffffffffdb4;
      }
    }
    else {
      LOCK();
      uVar2 = *puVar6;
      local_21 = local_dc == uVar2;
      if (local_21) {
        *puVar6 = uVar1;
        uVar2 = local_dc;
      }
      UNLOCK();
      if (!local_21) {
        local_dc = uVar2;
      }
    }
    break;
  case 4:
    if (local_1c - memory_order_consume < 2) {
      LOCK();
      uVar2 = *puVar6;
      local_21 = local_dc == uVar2;
      if (local_21) {
        *puVar6 = uVar1;
        uVar2 = local_dc;
      }
      UNLOCK();
      if (!local_21) {
        local_dc = uVar2;
      }
    }
    else if (local_1c == memory_order_seq_cst) {
      LOCK();
      uVar2 = *puVar6;
      local_21 = local_dc == uVar2;
      if (local_21) {
        *puVar6 = uVar1;
        uVar2 = local_dc;
      }
      UNLOCK();
      if (!local_21) {
        local_dc = uVar2;
      }
    }
    else {
      LOCK();
      uVar2 = *puVar6;
      local_21 = local_dc == uVar2;
      if (local_21) {
        *puVar6 = uVar1;
        uVar2 = local_dc;
      }
      UNLOCK();
      if (!local_21) {
        local_dc = uVar2;
      }
    }
  }
  local_10 = &local_dc;
  local_8 = puVar6;
  std::vector<char,_al::allocator<char,_1UL>_>::~vector
            ((vector<char,_al::allocator<char,_1UL>_> *)
             CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  return;
}

Assistant:

void ALCcontext::setError(ALenum errorCode, const char *msg, ...)
{
    auto message = al::vector<char>(256);

    va_list args, args2;
    va_start(args, msg);
    va_copy(args2, args);
    int msglen{std::vsnprintf(message.data(), message.size(), msg, args)};
    if(msglen >= 0 && static_cast<size_t>(msglen) >= message.size())
    {
        message.resize(static_cast<size_t>(msglen) + 1u);
        msglen = std::vsnprintf(message.data(), message.size(), msg, args2);
    }
    va_end(args2);
    va_end(args);

    if(msglen >= 0) msg = message.data();
    else msg = "<internal error constructing message>";

    WARN("Error generated on context %p, code 0x%04x, \"%s\"\n",
        decltype(std::declval<void*>()){this}, errorCode, msg);
    if(TrapALError)
    {
#ifdef _WIN32
        /* DebugBreak will cause an exception if there is no debugger */
        if(IsDebuggerPresent())
            DebugBreak();
#elif defined(SIGTRAP)
        raise(SIGTRAP);
#endif
    }

    ALenum curerr{AL_NO_ERROR};
    mLastError.compare_exchange_strong(curerr, errorCode);
}